

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.cpp
# Opt level: O2

void __thiscall
Trace::SetLogSettings(Trace *this,string *inLogFilePath,bool inShouldLog,bool inPlaceUTF8Bom)

{
  Log *this_00;
  
  this->mShouldLog = inShouldLog;
  this->mPlaceUTF8Bom = inPlaceUTF8Bom;
  std::__cxx11::string::_M_assign((string *)&this->mLogFilePath);
  this->mLogStream = (IByteWriter *)0x0;
  this_00 = this->mLog;
  if (this_00 != (Log *)0x0) {
    Log::~Log(this_00);
    operator_delete(this_00,0x60);
    this->mLog = (Log *)0x0;
  }
  return;
}

Assistant:

void Trace::SetLogSettings(const std::string& inLogFilePath,bool inShouldLog,bool inPlaceUTF8Bom)
{
	mShouldLog = inShouldLog;
	mPlaceUTF8Bom = inPlaceUTF8Bom;
	mLogFilePath = inLogFilePath;
	mLogStream = NULL;
	if(mLog != NULL)
	{
		delete mLog;
		mLog = NULL;
		//if(mShouldLog)
		//	mLog = new Log(mLogFilePath,inPlaceUTF8Bom);
	}
}